

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

box3f * __thiscall pbrt::Object::getBounds(box3f *__return_storage_ptr__,Object *this)

{
  box3f *this_00;
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  element_type *peVar4;
  undefined8 uVar5;
  float fVar6;
  pthread_mutex_t *__mutex;
  shared_ptr<pbrt::Instance> *inst;
  pointer psVar7;
  pointer psVar8;
  box3f ib;
  box3f local_50;
  pthread_mutex_t *local_38;
  
  if (this->haveComputedBounds == true) {
    fVar6 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar6;
    fVar6 = (this->bounds).lower.y;
    uVar5 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar6;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar5;
  }
  else {
    __mutex = (pthread_mutex_t *)&this->mutex;
    std::mutex::lock((mutex *)&__mutex->__data);
    this_00 = &this->bounds;
    if (this->haveComputedBounds == true) {
      fVar6 = (this->bounds).upper.z;
      (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
      (__return_storage_ptr__->upper).z = fVar6;
      fVar6 = (this_00->lower).y;
      uVar5 = *(undefined8 *)&(this->bounds).lower.z;
      (__return_storage_ptr__->lower).x = (this_00->lower).x;
      (__return_storage_ptr__->lower).y = fVar6;
      *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar5;
    }
    else {
      (this->bounds).lower.x = 3.4028235e+38;
      (this->bounds).lower.y = 3.4028235e+38;
      *(undefined8 *)&(this->bounds).lower.z = 0xff7fffff7f7fffff;
      (this->bounds).upper.y = -3.4028235e+38;
      (this->bounds).upper.z = -3.4028235e+38;
      psVar1 = (this->instances).
               super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = __mutex;
      for (psVar7 = (this->instances).
                    super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1
          ) {
        peVar2 = (psVar7->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          (*(peVar2->super_Entity)._vptr_Entity[3])(&local_50);
          if (((local_50.lower.x <= local_50.upper.x) && (local_50.lower.y <= local_50.upper.y)) &&
             (local_50.lower.z <= local_50.upper.z)) {
            math::box3f::extend(this_00,&local_50);
          }
        }
      }
      psVar3 = (this->shapes).
               super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar8 = (this->shapes).
                    super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar3; psVar8 = psVar8 + 1
          ) {
        peVar4 = (psVar8->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar4 != (element_type *)0x0) {
          (*(peVar4->super_Entity)._vptr_Entity[6])(&local_50);
          if (((local_50.lower.x <= local_50.upper.x) && (local_50.lower.y <= local_50.upper.y)) &&
             (local_50.lower.z <= local_50.upper.z)) {
            math::box3f::extend(this_00,&local_50);
          }
        }
      }
      this->haveComputedBounds = true;
      fVar6 = (this->bounds).upper.z;
      (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
      (__return_storage_ptr__->upper).z = fVar6;
      fVar6 = (this_00->lower).y;
      uVar5 = *(undefined8 *)&(this->bounds).lower.z;
      (__return_storage_ptr__->lower).x = (this_00->lower).x;
      (__return_storage_ptr__->lower).y = fVar6;
      *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar5;
      __mutex = local_38;
    }
    pthread_mutex_unlock(__mutex);
  }
  return __return_storage_ptr__;
}

Assistant:

box3f Object::getBounds() 
  {
    if (haveComputedBounds) return bounds;

    std::lock_guard<std::mutex> lock(mutex);
    if (haveComputedBounds) return bounds;
    
    bounds = box3f::empty_box();
    for (auto &inst : instances) {
      if (inst) {
        const box3f ib = inst->getBounds();
        if (!ib.empty())
          bounds.extend(ib);
      }
    }
    for (auto &geom : shapes) {
      if (geom) {
        const box3f gb = geom->getBounds();
        if (!gb.empty())
          bounds.extend(gb);
      }
    }
    haveComputedBounds = true;
    return bounds;
  }